

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::vector
          (vector<immutable::vector<char,_false,_6>,_true,_5> *this)

{
  vector<immutable::vector<char,_false,_6>,_true,_5> *this_local;
  
  rrb_create<immutable::vector<char,false,6>,true,5>();
  return;
}

Assistant:

vector() = default;